

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * doctest::StringMaker<std::tuple<int>_>::convert
                   (String *__return_storage_ptr__,tuple<int> *in)

{
  ostream *poVar1;
  ostringstream oss;
  long *local_1b0;
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"(",1);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (local_190,
                      (in->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>.
                      _M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  String::String(__return_storage_ptr__,(char *)local_1b0);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static String convert(const std::tuple<T>& in)
  {
    std::ostringstream oss;
    oss << "(" << std::get<0>(in) << ")";
    return oss.str().c_str();
  }